

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_node_sequence_insert_after(fy_node *fyn_seq,fy_node *fyn_mark,fy_node *fyn)

{
  list_head *plVar1;
  _Bool _Var2;
  int iVar3;
  fy_node *pfVar4;
  int iVar5;
  
  _Var2 = fy_node_sequence_contains_node(fyn_seq,fyn_mark);
  iVar5 = -1;
  if (_Var2) {
    iVar3 = fy_node_sequence_insert_prepare(fyn_seq,fyn);
    if (iVar3 == 0) {
      if (fyn_seq != (fy_node *)0x0) {
        fyn_seq->field_0x34 = fyn_seq->field_0x34 | 0x10;
        for (pfVar4 = fyn_seq->parent; pfVar4 != (fy_node *)0x0; pfVar4 = pfVar4->parent) {
          pfVar4->field_0x34 = pfVar4->field_0x34 | 0x10;
        }
      }
      if (fyn != (fy_node *)0x0 && fyn_mark != (fy_node *)0x0) {
        plVar1 = (fyn_mark->node).next;
        plVar1->prev = &fyn->node;
        (fyn->node).next = plVar1;
        (fyn->node).prev = &fyn_mark->node;
        (fyn_mark->node).next = &fyn->node;
      }
      fyn->field_0x34 = fyn->field_0x34 | 8;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int fy_node_sequence_insert_after(struct fy_node *fyn_seq,
                                  struct fy_node *fyn_mark, struct fy_node *fyn) {
    int ret;

    if (!fy_node_sequence_contains_node(fyn_seq, fyn_mark))
        return -1;

    ret = fy_node_sequence_insert_prepare(fyn_seq, fyn);
    if (ret)
        return ret;

    fy_node_mark_synthetic(fyn_seq);
    fy_node_list_insert_after(&fyn_seq->sequence, fyn_mark, fyn);
    fyn->attached = true;

    return 0;
}